

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O2

string * __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::operator()[abi_cxx11_
          (string *__return_storage_ptr__,
          rt_latex_translator<viennamath::rt_expression_interface<double>> *this,Interval *e,
          bool use_parenthesis)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198," [ ");
  operator()[abi_cxx11_(&local_1c8,this,&e->lower_,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,"; ");
  operator()[abi_cxx11_(&sStack_1e8,this,&e->upper_,false);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1e8);
  std::operator<<(poVar1," ] ");
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(Interval   const & e, bool use_parenthesis = false) const
      {
        std::stringstream ss;
        ss << " [ " << operator()(e.lower()) << "; " << operator()(e.upper()) << " ] ";
        (void)use_parenthesis; //to silence unused parameter warnings
        return ss.str();
      }